

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutablePrimitiveOneofFieldLiteGenerator::GenerateMembers
          (ImmutablePrimitiveOneofFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutablePrimitiveOneofFieldLiteGenerator *this_local;
  
  PrintExtraFieldInfo(&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,printer);
  descriptor = FieldDescriptor::file((this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_)
  ;
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
    io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,
                       "$deprecation$public boolean has$capitalized_name$() {\n  return $has_oneof_case_message$;\n}\n"
                      );
  }
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,
                     "$deprecation$public $type$ get$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    return ($boxed_type$) $oneof_name$_;\n  }\n  return $default$;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,
                     "private void set$capitalized_name$($type$ value) {\n$null_check$  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n}\n"
                    );
  WriteFieldDocComment(printer,(this->super_ImmutablePrimitiveFieldLiteGenerator).descriptor_);
  io::Printer::Print(printer,&(this->super_ImmutablePrimitiveFieldLiteGenerator).variables_,
                     "private void clear$capitalized_name$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n  }\n}\n"
                    );
  return;
}

Assistant:

void ImmutablePrimitiveOneofFieldLiteGenerator::
GenerateMembers(io::Printer* printer) const {
  PrintExtraFieldInfo(variables_, printer);
  if (SupportFieldPresence(descriptor_->file())) {
    WriteFieldDocComment(printer, descriptor_);
    printer->Print(variables_,
      "$deprecation$public boolean has$capitalized_name$() {\n"
      "  return $has_oneof_case_message$;\n"
      "}\n");
  }

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "$deprecation$public $type$ get$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    return ($boxed_type$) $oneof_name$_;\n"
    "  }\n"
    "  return $default$;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void set$capitalized_name$($type$ value) {\n"
    "$null_check$"
    "  $set_oneof_case_message$;\n"
    "  $oneof_name$_ = value;\n"
    "}\n");

  WriteFieldDocComment(printer, descriptor_);
  printer->Print(variables_,
    "private void clear$capitalized_name$() {\n"
    "  if ($has_oneof_case_message$) {\n"
    "    $clear_oneof_case_message$;\n"
    "    $oneof_name$_ = null;\n"
    "  }\n"
    "}\n");
}